

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaAllocator_T::~VmaAllocator_T(VmaAllocator_T *this)

{
  VmaBlockVector *this_00;
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(this->m_MemProps).memoryTypeCount;
  while (uVar1 = uVar2 - 1, uVar2 != 0) {
    this_00 = this->m_pBlockVectors[uVar2 - 1];
    uVar2 = uVar1;
    if (this_00 != (VmaBlockVector *)0x0) {
      VmaBlockVector::~VmaBlockVector(this_00);
      VmaFree(&this->m_AllocationCallbacks,this_00);
    }
  }
  VmaPoolAllocator<VmaAllocation_T>::~VmaPoolAllocator
            (&(this->m_AllocationObjectAllocator).m_Allocator);
  return;
}

Assistant:

VmaAllocator_T::~VmaAllocator_T()
{
    VMA_ASSERT(m_Pools.IsEmpty());

    for(size_t memTypeIndex = GetMemoryTypeCount(); memTypeIndex--; )
    {
        vma_delete(this, m_pBlockVectors[memTypeIndex]);
    }
}